

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG *data)

{
  size_t __size;
  int iVar1;
  int iVar2;
  REF_MPI pRVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  REF_INT *send_size;
  long lVar8;
  REF_INT *recv_size;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  undefined8 uVar14;
  REF_INT n;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  REF_INT local;
  REF_INT nodes [27];
  uint local_12c;
  undefined1 local_128 [16];
  REF_MPI local_110;
  REF_NODE local_108;
  uint local_fc;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  REF_INT local_dc;
  undefined4 *local_d8;
  void *local_d0;
  void *local_c8;
  ulong local_c0;
  REF_LONG *local_b8;
  ulong local_b0;
  REF_INT local_a8 [30];
  
  pRVar3 = ref_node->ref_mpi;
  uVar5 = pRVar3->n;
  if ((long)(int)uVar5 < 2) {
    return 0;
  }
  __size = (long)(int)uVar5 * 4;
  local_108 = ref_node;
  send_size = (REF_INT *)malloc(__size);
  auVar4 = _DAT_00200a10;
  if (send_size == (REF_INT *)0x0) {
    pcVar15 = "malloc a_size of REF_INT NULL";
    uVar14 = 0x572;
  }
  else {
    lVar8 = (ulong)uVar5 - 1;
    auVar21._8_4_ = (int)lVar8;
    auVar21._0_8_ = lVar8;
    auVar21._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    local_128 = auVar21 ^ _DAT_00200a10;
    auVar22 = _DAT_00202f40;
    auVar19 = _DAT_00200a00;
    do {
      auVar21 = auVar19 ^ auVar4;
      iVar16 = local_128._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar16 && local_128._0_4_ < auVar21._0_4_ ||
                  iVar16 < auVar21._4_4_) & 1)) {
        *(undefined4 *)((long)send_size + lVar8) = 0;
      }
      if ((auVar21._12_4_ != local_128._12_4_ || auVar21._8_4_ <= local_128._8_4_) &&
          auVar21._12_4_ <= local_128._12_4_) {
        *(undefined4 *)((long)send_size + lVar8 + 4) = 0;
      }
      auVar21 = auVar22 ^ auVar4;
      iVar13 = auVar21._4_4_;
      if (iVar13 <= iVar16 && (iVar13 != iVar16 || auVar21._0_4_ <= local_128._0_4_)) {
        *(undefined4 *)((long)send_size + lVar8 + 8) = 0;
        *(undefined4 *)((long)send_size + lVar8 + 0xc) = 0;
      }
      lVar9 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar9 + 4;
      lVar9 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar9 + 4;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar8);
    local_110 = pRVar3;
    local_b8 = data;
    recv_size = (REF_INT *)malloc(__size);
    auVar4 = _DAT_00200a10;
    if (recv_size == (REF_INT *)0x0) {
      pcVar15 = "malloc b_size of REF_INT NULL";
      uVar14 = 0x573;
    }
    else {
      lVar8 = 0;
      auVar18 = _DAT_00202f40;
      auVar20 = _DAT_00200a00;
      do {
        auVar22 = auVar20 ^ auVar4;
        if ((bool)(~(auVar22._4_4_ == local_128._4_4_ && (int)local_128._0_4_ < auVar22._0_4_ ||
                    (int)local_128._4_4_ < auVar22._4_4_) & 1)) {
          *(undefined4 *)((long)recv_size + lVar8) = 0;
        }
        if ((auVar22._12_4_ != local_128._12_4_ || auVar22._8_4_ <= (int)local_128._8_4_) &&
            auVar22._12_4_ <= (int)local_128._12_4_) {
          *(undefined4 *)((long)recv_size + lVar8 + 4) = 0;
        }
        auVar22 = auVar18 ^ auVar4;
        iVar16 = auVar22._4_4_;
        if (iVar16 <= (int)local_128._4_4_ &&
            (iVar16 != local_128._4_4_ || auVar22._0_4_ <= (int)local_128._0_4_)) {
          *(undefined4 *)((long)recv_size + lVar8 + 8) = 0;
          *(undefined4 *)((long)recv_size + lVar8 + 0xc) = 0;
        }
        lVar9 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 4;
        auVar20._8_8_ = lVar9 + 4;
        lVar9 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 4;
        auVar18._8_8_ = lVar9 + 4;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar8);
      if (0 < ref_cell->max) {
        iVar16 = 0;
        do {
          if (ref_cell->c2n[(long)iVar16 * (long)ref_cell->size_per] != -1) {
            uVar5 = ref_cell_part(ref_cell,local_108,iVar16,(REF_INT *)&local_12c);
            if (uVar5 != 0) {
              pcVar15 = "cell part";
              uVar14 = 0x576;
              goto LAB_001cdee1;
            }
            if (local_12c != local_110->id) {
              send_size[(int)local_12c] = send_size[(int)local_12c] + 1;
            }
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < ref_cell->max);
      }
      pRVar3 = local_110;
      uVar5 = ref_mpi_alltoall(local_110,send_size,recv_size,1);
      if (uVar5 != 0) {
        pcVar15 = "alltoall sizes";
        uVar14 = 0x57b;
LAB_001cdee1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar14,"ref_cell_ghost_long",(ulong)uVar5,pcVar15);
        return uVar5;
      }
      uVar5 = pRVar3->n;
      lVar8 = (long)(int)uVar5;
      if (lVar8 < 1) {
        uVar17 = 0;
      }
      else {
        lVar9 = 0;
        uVar17 = 0;
        do {
          uVar17 = uVar17 + send_size[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
      }
      uVar6 = ref_cell->node_per * uVar17;
      if ((int)uVar6 < 0) {
        pcVar15 = "malloc a_nodes of REF_GLOB negative";
        uVar14 = 0x57f;
LAB_001ce00a:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar14,"ref_cell_ghost_long",pcVar15);
        return 1;
      }
      local_128._0_4_ = ref_cell->node_per;
      pvVar10 = malloc((ulong)uVar6 << 3);
      if (pvVar10 == (void *)0x0) {
        pcVar15 = "malloc a_nodes of REF_GLOB NULL";
        uVar14 = 0x57f;
      }
      else {
        if ((int)uVar17 < 0) {
          pcVar15 = "malloc a_data of REF_LONG negative";
          uVar14 = 0x580;
          goto LAB_001ce00a;
        }
        local_c0 = (ulong)uVar17;
        pvVar11 = malloc(local_c0 * 8);
        if (pvVar11 == (void *)0x0) {
          pcVar15 = "malloc a_data of REF_LONG NULL";
          uVar14 = 0x580;
        }
        else {
          local_c8 = pvVar11;
          pvVar11 = malloc(local_c0 * 4);
          if (pvVar11 == (void *)0x0) {
            pcVar15 = "malloc a_cell of REF_INT NULL";
            uVar14 = 0x581;
          }
          else {
            if ((int)uVar5 < 1) {
              uVar12 = 0;
            }
            else {
              lVar9 = 0;
              uVar12 = 0;
              do {
                uVar12 = (ulong)(uint)((int)uVar12 + recv_size[lVar9]);
                lVar9 = lVar9 + 1;
              } while (lVar8 != lVar9);
            }
            iVar16 = (int)uVar12;
            local_e8 = pvVar10;
            if (iVar16 * local_128._0_4_ < 0) {
              pcVar15 = "malloc b_nodes of REF_GLOB negative";
              uVar14 = 0x585;
              goto LAB_001ce00a;
            }
            local_d0 = pvVar11;
            pvVar10 = malloc((ulong)(uint)(iVar16 * local_128._0_4_) << 3);
            if (pvVar10 == (void *)0x0) {
              pcVar15 = "malloc b_nodes of REF_GLOB NULL";
              uVar14 = 0x585;
            }
            else {
              if (iVar16 < 0) {
                pcVar15 = "malloc b_data of REF_LONG negative";
                uVar14 = 0x586;
                goto LAB_001ce00a;
              }
              local_f0 = pvVar10;
              local_b0 = uVar12;
              pvVar10 = malloc(uVar12 * 8);
              if (pvVar10 == (void *)0x0) {
                pcVar15 = "malloc b_data of REF_LONG NULL";
                uVar14 = 0x586;
              }
              else {
                if ((int)uVar5 < 0) {
                  pcVar15 = "malloc a_next of REF_INT negative";
                  uVar14 = 0x588;
                  goto LAB_001ce00a;
                }
                local_f8 = pvVar10;
                local_d8 = (undefined4 *)malloc(lVar8 * 4);
                if (local_d8 != (undefined4 *)0x0) {
                  *local_d8 = 0;
                  local_12c = 1;
                  if (1 < uVar5) {
                    lVar9 = 0;
                    iVar13 = 0;
                    do {
                      iVar13 = iVar13 + send_size[lVar9];
                      local_d8[lVar9 + 1] = iVar13;
                      lVar9 = lVar9 + 1;
                      local_12c = uVar5;
                    } while (lVar8 + -1 != lVar9);
                  }
                  if (ref_cell->max < 1) {
                    uVar5 = 0;
                    n = local_128._0_4_;
                  }
                  else {
                    uVar12 = 0;
                    do {
                      RVar7 = ref_cell_nodes(ref_cell,(REF_INT)uVar12,local_a8);
                      if (RVar7 == 0) {
                        local_128._0_8_ = uVar12;
                        uVar5 = ref_cell_part(ref_cell,local_108,(REF_INT)uVar12,
                                              (REF_INT *)&local_12c);
                        if (uVar5 != 0) {
                          pcVar15 = "cell part";
                          uVar14 = 0x58e;
                          goto LAB_001cdee1;
                        }
                        uVar12 = local_128._0_8_;
                        if (local_12c != local_110->id) {
                          iVar13 = local_d8[(int)local_12c];
                          *(int *)((long)local_d0 + (long)iVar13 * 4) = local_128._0_4_;
                          iVar1 = ref_cell->node_per;
                          if (0 < (long)iVar1) {
                            lVar8 = 0;
                            do {
                              iVar2 = local_a8[lVar8];
                              lVar9 = -1;
                              if (((-1 < (long)iVar2) && (iVar2 < local_108->max)) &&
                                 (lVar9 = local_108->global[iVar2], lVar9 < 0)) {
                                lVar9 = -1;
                              }
                              *(long *)((long)local_e8 + lVar8 * 8 + (long)(iVar1 * iVar13) * 8) =
                                   lVar9;
                              lVar8 = lVar8 + 1;
                            } while (iVar1 != lVar8);
                          }
                          local_d8[(int)local_12c] = iVar13 + 1;
                        }
                      }
                      uVar5 = (int)uVar12 + 1;
                      uVar12 = (ulong)uVar5;
                    } while ((int)uVar5 < ref_cell->max);
                    n = ref_cell->node_per;
                  }
                  local_fc = uVar5;
                  uVar5 = ref_mpi_alltoallv(local_110,local_e8,send_size,local_f0,recv_size,n,2);
                  if (uVar5 == 0) {
                    if (iVar16 != 0) {
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = local_128._8_8_;
                      local_128 = auVar4 << 0x40;
                      do {
                        uVar12 = (ulong)(uint)ref_cell->node_per;
                        if (0 < ref_cell->node_per) {
                          lVar8 = 0;
                          do {
                            uVar5 = ref_node_local(local_108,
                                                   *(REF_GLOB *)
                                                    ((long)local_f0 +
                                                    ((int)uVar12 * local_128._0_4_ + lVar8) * 8),
                                                   &local_dc);
                            if (uVar5 != 0) {
                              pcVar15 = "local";
                              uVar14 = 0x5a1;
                              goto LAB_001cdee1;
                            }
                            local_a8[lVar8] = local_dc;
                            lVar8 = lVar8 + 1;
                            uVar12 = (ulong)ref_cell->node_per;
                          } while (lVar8 < (long)uVar12);
                        }
                        uVar5 = ref_cell_with(ref_cell,local_a8,(REF_INT *)&local_fc);
                        if (uVar5 != 0) {
                          pcVar15 = "find cell";
                          uVar14 = 0x5a4;
                          goto LAB_001cdee1;
                        }
                        *(REF_LONG *)((long)local_f8 + local_128._0_8_ * 8) =
                             local_b8[(int)local_fc];
                        uVar12 = local_128._0_8_ + 1;
                        local_128._0_8_ = uVar12;
                      } while (uVar12 != local_b0);
                    }
                    uVar5 = ref_mpi_alltoallv(local_110,local_f8,recv_size,local_c8,send_size,1,2);
                    pvVar11 = local_c8;
                    pvVar10 = local_d0;
                    if (uVar5 == 0) {
                      if (uVar17 != 0) {
                        uVar12 = 0;
                        do {
                          local_b8[*(int *)((long)local_d0 + uVar12 * 4)] =
                               *(REF_LONG *)((long)local_c8 + uVar12 * 8);
                          uVar12 = uVar12 + 1;
                        } while (local_c0 != uVar12);
                      }
                      free(local_d8);
                      free(local_f8);
                      free(local_f0);
                      free(pvVar10);
                      free(pvVar11);
                      free(local_e8);
                      free(recv_size);
                      free(send_size);
                      return 0;
                    }
                    pcVar15 = "alltoallv return data";
                    uVar14 = 0x5aa;
                  }
                  else {
                    pcVar15 = "alltoallv requested nodes";
                    uVar14 = 0x59c;
                  }
                  goto LAB_001cdee1;
                }
                pcVar15 = "malloc a_next of REF_INT NULL";
                uVar14 = 0x588;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar14,
         "ref_cell_ghost_long",pcVar15);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell, REF_NODE ref_node,
                                       REF_LONG *data) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT cell;
  REF_INT part;
  REF_INT *a_next, *a_cell;
  REF_GLOB *a_nodes, *b_nodes;
  REF_LONG *a_data, *b_data;

  REF_INT cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_INT local;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, ref_cell_node_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_LONG);
  ref_malloc(a_cell, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, ref_cell_node_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_LONG);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_cell[a_next[part]] = cell;
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        a_nodes[cell_node + ref_cell_node_per(ref_cell) * a_next[part]] =
            ref_node_global(ref_node, nodes[cell_node]);
      }
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size,
                        ref_cell_node_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      global = b_nodes[cell_node + ref_cell_node_per(ref_cell) * request];
      RSS(ref_node_local(ref_node, global, &(local)), "local");
      nodes[cell_node] = local;
    }
    RSS(ref_cell_with(ref_cell, nodes, &cell), "find cell");
    b_data[request] = data[cell];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_LONG_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_cell[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_cell);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}